

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_matcher.hpp
# Opt level: O0

bool __thiscall
boost::xpressive::detail::
string_matcher<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,mpl_::bool_<false>>
::
match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,boost::xpressive::detail::matchable_ex<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>
          (string_matcher<boost::xpressive::regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_>,_mpl_::bool_<false>_>
           *this,match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *state,
          matchable_ex<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *next)

{
  char *pcVar1;
  bool bVar2;
  char cVar3;
  reference pcVar4;
  regex_traits<char,_boost::xpressive::cpp_regex_traits<char>_> *prVar5;
  ulong uVar6;
  long *in_RDX;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_RSI;
  match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDI;
  bool bVar7;
  char_type *begin;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  tmp;
  char *local_30;
  
  pcVar1 = in_RSI->_M_current;
  local_30 = data_begin<char,std::char_traits<char>,std::allocator<char>>
                       ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        0x154d8f);
  while( true ) {
    if (local_30 == (in_RDI->end_)._M_current) {
      uVar6 = (**(code **)(*in_RDX + 0x10))(in_RDX,in_RSI);
      bVar7 = (uVar6 & 1) != 0;
      if (!bVar7) {
        in_RSI->_M_current = pcVar1;
      }
      return bVar7;
    }
    bVar2 = match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::eos(in_RDI);
    bVar7 = true;
    if (!bVar2) {
      pcVar4 = __gnu_cxx::
               __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*(in_RSI);
      cVar3 = *pcVar4;
      prVar5 = traits_cast<boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                         ((match_state<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)0x154dd9);
      cVar3 = translate<char,boost::xpressive::regex_traits<char,boost::xpressive::cpp_regex_traits<char>>>
                        ((int)cVar3,prVar5);
      bVar7 = cVar3 != *local_30;
    }
    if (bVar7) break;
    local_30 = local_30 + 1;
    __gnu_cxx::
    __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator++(in_RSI);
  }
  in_RSI->_M_current = pcVar1;
  return false;
}

Assistant:

bool match(match_state<BidiIter> &state, Next const &next) const
        {
            BidiIter const tmp = state.cur_;
            char_type const *begin = detail::data_begin(this->str_);
            for(; begin != this->end_; ++begin, ++state.cur_)
            {
                if(state.eos() ||
                    (detail::translate(*state.cur_, traits_cast<Traits>(state), icase_type()) != *begin))
                {
                    state.cur_ = tmp;
                    return false;
                }
            }

            if(next.match(state))
            {
                return true;
            }

            state.cur_ = tmp;
            return false;
        }